

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

el_action_t ed_prev_char(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  el_action_t eVar2;
  wchar_t *pwVar3;
  
  pwVar1 = (el->el_line).buffer;
  pwVar3 = (el->el_line).cursor;
  eVar2 = '\x06';
  if (pwVar1 < pwVar3) {
    pwVar3 = pwVar3 + -(long)(el->el_state).argument;
    if (pwVar3 < pwVar1) {
      pwVar3 = pwVar1;
    }
    (el->el_line).cursor = pwVar3;
    eVar2 = '\x05';
    if (((el->el_map).type == L'\x01') && ((el->el_chared).c_vcmd.action != L'\0')) {
      cv_delfini(el);
      eVar2 = '\x04';
    }
  }
  return eVar2;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
ed_prev_char(EditLine *el, wint_t c __attribute__((__unused__)))
{

	if (el->el_line.cursor > el->el_line.buffer) {
		el->el_line.cursor -= el->el_state.argument;
		if (el->el_line.cursor < el->el_line.buffer)
			el->el_line.cursor = el->el_line.buffer;

		if (el->el_map.type == MAP_VI)
			if (el->el_chared.c_vcmd.action != NOP) {
				cv_delfini(el);
				return CC_REFRESH;
			}
		return CC_CURSOR;
	} else
		return CC_ERROR;
}